

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

bool __thiscall
Js::RangeUnitContains<Js::SourceFunctionNode>
          (Js *this,RangeUnit<Js::SourceFunctionNode> unit,SourceFunctionNode n)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_24;
  uint uStack_20;
  SourceFunctionNode n_local;
  RangeUnit<Js::SourceFunctionNode> unit_local;
  
  uStack_20 = unit.j.functionId;
  if (uStack_20 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x7c,"(n.functionId != (uint32)-1)","n.functionId != (uint32)-1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_24 = unit.j.sourceContextId;
  n_local.sourceContextId = (uint)this;
  if ((local_24 < n_local.sourceContextId) ||
     (unit_local.i.sourceContextId = unit.i.sourceContextId, unit_local.i.sourceContextId < local_24
     )) {
    unit_local.j.sourceContextId._3_1_ = false;
  }
  else {
    unit_local.i.functionId = unit.i.functionId;
    if (((local_24 == unit_local.i.sourceContextId) && (unit_local.i.functionId == 0xfffffffe)) ||
       ((n_local.functionId = (LocalFunctionId)((ulong)this >> 0x20),
        local_24 == n_local.sourceContextId && (n_local.functionId == 0xfffffffe)))) {
      unit_local.j.sourceContextId._3_1_ = true;
    }
    else if (((local_24 == unit_local.i.sourceContextId) && (unit_local.i.functionId == 0xffffffff))
            || ((local_24 == n_local.sourceContextId && (n_local.functionId == 0xffffffff)))) {
      unit_local.j.sourceContextId._3_1_ = uStack_20 != 0;
    }
    else if (((local_24 == n_local.sourceContextId) && (uStack_20 < n_local.functionId)) ||
            ((local_24 == unit_local.i.sourceContextId && (unit_local.i.functionId < uStack_20)))) {
      unit_local.j.sourceContextId._3_1_ = false;
    }
    else {
      unit_local.j.sourceContextId._3_1_ = true;
    }
  }
  return unit_local.j.sourceContextId._3_1_;
}

Assistant:

bool RangeUnitContains<SourceFunctionNode>(RangeUnit<SourceFunctionNode> unit, SourceFunctionNode n)
    {
        Assert(n.functionId != (uint32)-1);

        if ((n.sourceContextId >= unit.i.sourceContextId) &&
            (n.sourceContextId <= unit.j.sourceContextId)
            )
        {
            if ((n.sourceContextId == unit.j.sourceContextId && -2 == unit.j.functionId) ||  //#.#-#.* case
                (n.sourceContextId == unit.i.sourceContextId && -2 == unit.i.functionId)     //#.*-#.# case
                )
            {
                return true;
            }

            if ((n.sourceContextId == unit.j.sourceContextId && -1 == unit.j.functionId) || //#.#-#.+ case
                (n.sourceContextId == unit.i.sourceContextId && -1 == unit.i.functionId)     //#.+-#.# case
                )
            {
                return n.functionId != 0;
            }

            if ((n.sourceContextId == unit.i.sourceContextId && n.functionId < unit.i.functionId) || //excludes all values less than functionId LHS
                (n.sourceContextId == unit.j.sourceContextId && n.functionId > unit.j.functionId)) ////excludes all values greater than functionId RHS
            {
                return false;
            }

            return true;
        }

        return false;
    }